

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Error * ot::commissioner::Interpreter::GetJoinerType
                  (Error *__return_storage_ptr__,JoinerType *aType,string *aStr)

{
  pointer *ppcVar1;
  int iVar2;
  char *pcVar3;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar4;
  string_view fmt;
  format_args args;
  string local_c0;
  JoinerType *local_a0;
  format_string_checker<char> local_98;
  undefined1 local_60 [8];
  char *local_58;
  undefined1 local_50 [8];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  local_38 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_38;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_a0 = aType;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"meshcop","");
  utils::ToLower((string *)&local_98,aStr);
  utils::ToLower((string *)local_60,&local_c0);
  if (local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ == local_58) {
    if (local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ == (char *)0x0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp((void *)local_98._0_8_,(void *)CONCAT44(local_60._4_4_,local_60._0_4_),
                   (size_t)local_98.context_.super_basic_format_parse_context<char>.format_str_.
                           data_);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if ((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_) != local_50) {
    operator_delete((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_));
  }
  ppcVar1 = (pointer *)&local_98.context_.super_basic_format_parse_context<char>.format_str_.size_;
  if ((pointer *)local_98._0_8_ != ppcVar1) {
    operator_delete((void *)local_98._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (bVar4) {
    *local_a0 = kMeshCoP;
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ae","");
    utils::ToLower((string *)&local_98,aStr);
    utils::ToLower((string *)local_60,&local_c0);
    if (local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ == local_58) {
      if (local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ == (char *)0x0)
      {
        bVar4 = true;
      }
      else {
        iVar2 = bcmp((void *)local_98._0_8_,(void *)CONCAT44(local_60._4_4_,local_60._0_4_),
                     (size_t)local_98.context_.super_basic_format_parse_context<char>.format_str_.
                             data_);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if ((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_) != local_50) {
      operator_delete((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_));
    }
    if ((pointer *)local_98._0_8_ != ppcVar1) {
      operator_delete((void *)local_98._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if (bVar4) {
      *local_a0 = kAE;
    }
    else {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"nmkp","");
      utils::ToLower((string *)&local_98,aStr);
      utils::ToLower((string *)local_60,&local_c0);
      if (local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ == local_58) {
        if (local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ ==
            (char *)0x0) {
          bVar4 = true;
        }
        else {
          iVar2 = bcmp((void *)local_98._0_8_,(void *)CONCAT44(local_60._4_4_,local_60._0_4_),
                       (size_t)local_98.context_.super_basic_format_parse_context<char>.format_str_.
                               data_);
          bVar4 = iVar2 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if ((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_) != local_50) {
        operator_delete((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_));
      }
      if ((pointer *)local_98._0_8_ != ppcVar1) {
        operator_delete((void *)local_98._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if (bVar4) {
        *local_a0 = kNMKP;
      }
      else {
        local_98.types_[0] = 0xd;
        local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "{} is not a valid joiner type";
        local_98.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1d;
        local_98.context_.super_basic_format_parse_context<char>._16_8_ = 0x100000000;
        local_98.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        begin = "{} is not a valid joiner type";
        local_98.context_.types_ = local_98.types_;
        do {
          pcVar3 = begin + 1;
          if (*begin == '}') {
            if ((pcVar3 == "") || (*pcVar3 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar3 = begin + 2;
          }
          else if (*begin == '{') {
            pcVar3 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (begin,"",&local_98);
          }
          begin = pcVar3;
        } while (pcVar3 != "");
        local_98._0_8_ = (aStr->_M_dataplus)._M_p;
        local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             (char *)aStr->_M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x1d;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_98;
        ::fmt::v10::vformat_abi_cxx11_(&local_c0,(v10 *)"{} is not a valid joiner type",fmt,args);
        local_60._0_4_ = kInvalidArgs;
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        __return_storage_ptr__->mCode = local_60._0_4_;
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->mMessage,(string *)&local_58);
        if (local_58 != local_48) {
          operator_delete(local_58);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::GetJoinerType(JoinerType &aType, const std::string &aStr)
{
    Error error;

    if (CaseInsensitiveEqual(aStr, "meshcop"))
    {
        aType = JoinerType::kMeshCoP;
    }
    else if (CaseInsensitiveEqual(aStr, "ae"))
    {
        aType = JoinerType::kAE;
    }
    else if (CaseInsensitiveEqual(aStr, "nmkp"))
    {
        aType = JoinerType::kNMKP;
    }
    else
    {
        error = ERROR_INVALID_ARGS("{} is not a valid joiner type", aStr);
    }

    return error;
}